

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O2

int gray_raster_render(FT_Raster raster,FT_Raster_Params *params)

{
  uint uVar1;
  short *psVar2;
  FT_Bitmap *pFVar3;
  TCell *pTVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  TCoord TVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  short sVar16;
  ulong uVar17;
  int fill;
  uint *puVar18;
  int iVar19;
  uchar uVar20;
  long lVar21;
  uchar *__s;
  uint uVar22;
  uint uVar23;
  uchar *puVar24;
  uint uVar25;
  PCell *ppTVar26;
  gray_TWorker worker [1];
  uint *local_4288;
  gray_TWorker_ local_4268;
  FT_Span local_4108 [16];
  uint local_40a8;
  int local_40a4;
  TCell buffer [682];
  
  if (raster == (FT_Raster)0x0) {
    return 6;
  }
  if ((params->flags & 1U) == 0) {
    return 0x13;
  }
  psVar2 = (short *)params->source;
  if (psVar2 == (short *)0x0) {
    return 0x14;
  }
  if ((psVar2[1] != 0) && (0 < (long)*psVar2)) {
    if (*(long *)(psVar2 + 0xc) == 0) {
      return 0x14;
    }
    if (*(long *)(psVar2 + 4) == 0) {
      return 0x14;
    }
    if (*(short *)(*(long *)(psVar2 + 0xc) + -2 + (long)*psVar2 * 2) + 1 != (int)psVar2[1]) {
      return 0x14;
    }
    pFVar3 = params->target;
    local_4268.outline._32_8_ = *(undefined8 *)(psVar2 + 0x10);
    local_4268.outline.n_contours = psVar2[0];
    local_4268.outline.n_points = psVar2[1];
    local_4268.outline._4_2_ = psVar2[2];
    local_4268.outline._6_2_ = psVar2[3];
    local_4268.outline.points = *(FT_Vector **)(psVar2 + 4);
    local_4268.outline.tags = *(char **)(psVar2 + 8);
    local_4268.outline.contours = *(short **)(psVar2 + 0xc);
    if ((params->flags & 2U) == 0) {
      if (pFVar3 == (FT_Bitmap *)0x0) {
        return 6;
      }
      local_4268.max_ex = pFVar3->width;
      if (local_4268.max_ex == 0) {
        return 0;
      }
      uVar1 = pFVar3->rows;
      if (uVar1 == 0) {
        return 0;
      }
      if (pFVar3->buffer == (uchar *)0x0) {
        return 6;
      }
      local_4268.target.pitch = pFVar3->pitch;
      uVar10 = 0;
      uVar9 = (ulong)((uVar1 - 1) * local_4268.target.pitch);
      if (local_4268.target.pitch < 0) {
        uVar9 = uVar10;
      }
      local_4268.target.origin = pFVar3->buffer + uVar9;
      local_4268.min_ex = 0;
      local_4268.render_span = (FT_SpanFunc)0x0;
      local_4268.render_span_data = (void *)0x0;
    }
    else {
      local_4268.render_span = params->gray_spans;
      if (local_4268.render_span == (FT_SpanFunc)0x0) {
        return 0;
      }
      local_4268.render_span_data = params->user;
      local_4268.min_ex = (TCoord)(params->clip_box).xMin;
      uVar10 = (ulong)(uint)(params->clip_box).yMin;
      local_4268.max_ex = (TCoord)(params->clip_box).xMax;
      uVar1 = (uint)(params->clip_box).yMax;
    }
    if (local_4268.min_ex < local_4268.max_ex) {
      uVar11 = uVar1 - (int)uVar10;
      if (uVar11 == 0 || (int)uVar1 < (int)uVar10) {
        return 0;
      }
      local_4268.cell_null = buffer + 0x2a9;
      buffer[0x2a9].x = 0x7fffffff;
      buffer[0x2a9].cover = 0;
      buffer[0x2a9].area = 0;
      buffer[0x2a9].next = (PCell)0x0;
      local_4268.ycells = (PCell_conflict *)buffer;
      if (0x55 < uVar11) {
        uVar9 = ((long)(int)uVar11 + 0x54U) / 0x55;
        uVar11 = (uint)(((uVar9 + (long)(int)uVar11) - 1) / uVar9);
      }
      iVar6 = 0;
      do {
        local_4288 = &local_40a8;
        local_40a4 = (int)uVar10;
        if ((int)uVar1 <= local_40a4) {
          return 0;
        }
        uVar12 = uVar11 + local_40a4;
        local_40a8 = uVar1;
        if ((int)uVar12 < (int)uVar1) {
          local_40a8 = uVar12;
        }
        do {
          puVar18 = local_4288 + 1;
          local_4268.min_ey = local_4288[1];
          uVar9 = (long)(int)*local_4288 - (long)local_4268.min_ey;
          uVar25 = (uint)uVar9;
          uVar10 = 0;
          if (0 < (int)uVar25) {
            uVar10 = uVar9 & 0xffffffff;
          }
          for (uVar17 = 0; uVar10 != uVar17; uVar17 = uVar17 + 1) {
            *(PCell_conflict *)((TCoord *)local_4268.ycells + uVar17 * 2) = local_4268.cell_null;
          }
          local_4268.cell_free = buffer + (uVar9 * 8 + 0x17) / 0x18;
          local_4268.cell = local_4268.cell_null;
          local_4268.max_ey = *local_4288;
          local_4268.count_ey = uVar25;
          iVar6 = gray_convert_glyph_inner(&local_4268,iVar6);
          uVar5 = local_4268.outline._32_8_;
          if (iVar6 == 0x62) {
            if (uVar25 < 2) {
              return 0x62;
            }
            local_4288[2] = local_4288[1];
            local_4288[1] = ((int)uVar25 >> 1) + local_4288[1];
          }
          else {
            if (iVar6 != 0) {
              return iVar6;
            }
            uVar25 = 0x100;
            if ((local_4268.outline._32_8_ & 2) == 0) {
              uVar25 = 0x80000000;
            }
            uVar23 = local_4268.min_ey;
            if (local_4268.render_span == (FT_SpanFunc)0x0) {
              for (; puVar24 = local_4268.target.origin, (int)uVar23 < local_4268.max_ey;
                  uVar23 = uVar23 + 1) {
                lVar15 = (long)local_4268.target.pitch * (long)(int)uVar23;
                ppTVar26 = (PCell *)(((long)(int)uVar23 - (long)local_4268.min_ey) * 8 +
                                    (long)local_4268.ycells);
                iVar6 = 0;
                TVar8 = local_4268.min_ex;
                while( true ) {
                  pTVar4 = *ppTVar26;
                  lVar21 = (long)TVar8;
                  uVar22 = iVar6 >> 9;
                  if (pTVar4 == local_4268.cell_null) break;
                  if ((iVar6 != 0) &&
                     (iVar13 = pTVar4->x - TVar8, iVar13 != 0 && TVar8 <= pTVar4->x)) {
                    uVar22 = -(uint)((uVar22 & uVar25) != 0) ^ uVar22;
                    uVar14 = uVar22;
                    if ((uVar5 & 2) == 0) {
                      uVar14 = 0xff;
                    }
                    if ((int)uVar22 < 0x100) {
                      uVar14 = uVar22;
                    }
                    __s = puVar24 + (lVar21 - lVar15);
                    uVar20 = (uchar)uVar14;
                    switch(iVar13) {
                    case 0:
                      break;
                    case 7:
                      *__s = uVar20;
                      __s = __s + 1;
                    case 6:
                      *__s = uVar20;
                      __s = __s + 1;
                    case 5:
                      *__s = uVar20;
                      __s = __s + 1;
                    case 4:
                      *__s = uVar20;
                      __s = __s + 1;
                    case 3:
                      *__s = uVar20;
                      __s = __s + 1;
                    case 2:
                      *__s = uVar20;
                      __s = __s + 1;
                    case 1:
                      *__s = uVar20;
                      break;
                    default:
                      memset(__s,uVar14,(long)iVar13);
                    }
                  }
                  iVar13 = pTVar4->x;
                  iVar6 = iVar6 + pTVar4->cover * 0x200;
                  iVar19 = iVar6 - pTVar4->area;
                  if ((iVar19 != 0) && (local_4268.min_ex <= iVar13)) {
                    uVar14 = iVar19 >> 9;
                    uVar14 = -(uint)((uVar14 & uVar25) != 0) ^ uVar14;
                    uVar22 = (uint)(byte)(-((uVar5 & 2) == 0) | (byte)uVar14);
                    if ((int)uVar14 < 0x100) {
                      uVar22 = uVar14;
                    }
                    puVar24[iVar13 - lVar15] = (uchar)uVar22;
                    iVar13 = pTVar4->x;
                  }
                  TVar8 = iVar13 + 1;
                  ppTVar26 = &pTVar4->next;
                }
                if (iVar6 != 0) {
                  uVar22 = -(uint)((uVar22 & uVar25) != 0) ^ uVar22;
                  uVar14 = uVar22;
                  if ((uVar5 & 2) == 0) {
                    uVar14 = 0xff;
                  }
                  if ((int)uVar22 < 0x100) {
                    uVar14 = uVar22;
                  }
                  puVar24 = puVar24 + (lVar21 - lVar15);
                  uVar20 = (uchar)uVar14;
                  switch(local_4268.max_ex - lVar21 & 0xffffffff) {
                  case 0:
                    break;
                  case 7:
                    *puVar24 = uVar20;
                    puVar24 = puVar24 + 1;
                  case 6:
                    *puVar24 = uVar20;
                    puVar24 = puVar24 + 1;
                  case 5:
                    *puVar24 = uVar20;
                    puVar24 = puVar24 + 1;
                  case 4:
                    *puVar24 = uVar20;
                    puVar24 = puVar24 + 1;
                  case 3:
                    *puVar24 = uVar20;
                    puVar24 = puVar24 + 1;
                  case 2:
                    *puVar24 = uVar20;
                    puVar24 = puVar24 + 1;
                  case 1:
                    *puVar24 = uVar20;
                    break;
                  default:
                    memset(puVar24,uVar14,local_4268.max_ex - lVar21);
                  }
                }
              }
            }
            else {
              for (; (int)uVar23 < local_4268.max_ey; uVar23 = uVar23 + 1) {
                ppTVar26 = (PCell *)(((long)(int)uVar23 - (long)local_4268.min_ey) * 8 +
                                    (long)local_4268.ycells);
                iVar13 = 0;
                iVar19 = 0;
                iVar6 = local_4268.min_ex;
                while( true ) {
                  pTVar4 = *ppTVar26;
                  sVar16 = (short)iVar6;
                  uVar22 = iVar19 >> 9;
                  if (pTVar4 == local_4268.cell_null) break;
                  iVar7 = pTVar4->x;
                  if ((iVar19 != 0) && (iVar7 - iVar6 != 0 && iVar6 <= iVar7)) {
                    uVar22 = -(uint)((uVar22 & uVar25) != 0) ^ uVar22;
                    uVar14 = (uint)(byte)(-((uVar5 & 2) == 0) | (byte)uVar22);
                    if ((int)uVar22 < 0x100) {
                      uVar14 = uVar22;
                    }
                    local_4108[iVar13].coverage = (uchar)uVar14;
                    local_4108[iVar13].x = sVar16;
                    local_4108[iVar13].len = (unsigned_short)(iVar7 - iVar6);
                    iVar13 = iVar13 + 1;
                    if (iVar13 == 0x10) {
                      (*local_4268.render_span)(uVar23,0x10,local_4108,local_4268.render_span_data);
                      iVar7 = pTVar4->x;
                      iVar13 = 0;
                    }
                  }
                  iVar19 = pTVar4->cover * 0x200 + iVar19;
                  iVar6 = iVar19 - pTVar4->area;
                  if ((iVar6 != 0) && (local_4268.min_ex <= iVar7)) {
                    uVar14 = iVar6 >> 9;
                    uVar14 = -(uint)((uVar14 & uVar25) != 0) ^ uVar14;
                    uVar22 = (uint)(byte)(-((uVar5 & 2) == 0) | (byte)uVar14);
                    if ((int)uVar14 < 0x100) {
                      uVar22 = uVar14;
                    }
                    local_4108[iVar13].coverage = (uchar)uVar22;
                    local_4108[iVar13].x = (short)iVar7;
                    local_4108[iVar13].len = 1;
                    iVar13 = iVar13 + 1;
                    if (iVar13 == 0x10) {
                      (*local_4268.render_span)(uVar23,0x10,local_4108,local_4268.render_span_data);
                      iVar7 = pTVar4->x;
                      iVar13 = 0;
                    }
                  }
                  iVar6 = iVar7 + 1;
                  ppTVar26 = &pTVar4->next;
                }
                if (iVar19 != 0) {
                  uVar22 = -(uint)((uVar22 & uVar25) != 0) ^ uVar22;
                  uVar14 = (uint)(byte)(-((uVar5 & 2) == 0) | (byte)uVar22);
                  if ((int)uVar22 < 0x100) {
                    uVar14 = uVar22;
                  }
                  local_4108[iVar13].coverage = (uchar)uVar14;
                  local_4108[iVar13].x = sVar16;
                  local_4108[iVar13].len = (short)local_4268.max_ex - sVar16;
                  iVar13 = iVar13 + 1;
                }
                if (iVar13 != 0) {
                  (*local_4268.render_span)(uVar23,iVar13,local_4108,local_4268.render_span_data);
                }
              }
            }
            puVar18 = local_4288 + -1;
          }
          iVar6 = 1;
          local_4288 = puVar18;
        } while (&local_40a8 <= puVar18);
        uVar10 = (ulong)uVar12;
      } while( true );
    }
  }
  return 0;
}

Assistant:

static int
  gray_raster_render( FT_Raster                raster,
                      const FT_Raster_Params*  params )
  {
    const FT_Outline*  outline    = (const FT_Outline*)params->source;
    const FT_Bitmap*   target_map = params->target;

#ifndef FT_STATIC_RASTER
    gray_TWorker  worker[1];
#endif


    if ( !raster )
      return FT_THROW( Invalid_Argument );

    /* this version does not support monochrome rendering */
    if ( !( params->flags & FT_RASTER_FLAG_AA ) )
      return FT_THROW( Cannot_Render_Glyph );

    if ( !outline )
      return FT_THROW( Invalid_Outline );

    /* return immediately if the outline is empty */
    if ( outline->n_points == 0 || outline->n_contours <= 0 )
      return Smooth_Err_Ok;

    if ( !outline->contours || !outline->points )
      return FT_THROW( Invalid_Outline );

    if ( outline->n_points !=
           outline->contours[outline->n_contours - 1] + 1 )
      return FT_THROW( Invalid_Outline );

    ras.outline = *outline;

    if ( params->flags & FT_RASTER_FLAG_DIRECT )
    {
      if ( !params->gray_spans )
        return Smooth_Err_Ok;

      ras.render_span      = (FT_Raster_Span_Func)params->gray_spans;
      ras.render_span_data = params->user;

      ras.min_ex = params->clip_box.xMin;
      ras.min_ey = params->clip_box.yMin;
      ras.max_ex = params->clip_box.xMax;
      ras.max_ey = params->clip_box.yMax;
    }
    else
    {
      /* if direct mode is not set, we must have a target bitmap */
      if ( !target_map )
        return FT_THROW( Invalid_Argument );

      /* nothing to do */
      if ( !target_map->width || !target_map->rows )
        return Smooth_Err_Ok;

      if ( !target_map->buffer )
        return FT_THROW( Invalid_Argument );

      if ( target_map->pitch < 0 )
        ras.target.origin = target_map->buffer;
      else
        ras.target.origin = target_map->buffer
              + ( target_map->rows - 1 ) * (unsigned int)target_map->pitch;

      ras.target.pitch = target_map->pitch;

      ras.render_span      = (FT_Raster_Span_Func)NULL;
      ras.render_span_data = NULL;

      ras.min_ex = 0;
      ras.min_ey = 0;
      ras.max_ex = (FT_Pos)target_map->width;
      ras.max_ey = (FT_Pos)target_map->rows;
    }

    /* exit if nothing to do */
    if ( ras.max_ex <= ras.min_ex || ras.max_ey <= ras.min_ey )
      return Smooth_Err_Ok;

    return gray_convert_glyph( RAS_VAR );
  }